

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHintString(int hint,char *value)

{
  char *value_local;
  int hint_local;
  
  if (value != (char *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else if (hint == 0x23002) {
      strncpy(_glfw.hints.window.ns.frameName,value,0xff);
    }
    else if (hint == 0x24001) {
      strncpy(_glfw.hints.window.x11.className,value,0xff);
    }
    else if (hint == 0x24002) {
      strncpy(_glfw.hints.window.x11.instanceName,value,0xff);
    }
    else {
      _glfwInputError(0x10003,"Invalid window hint string 0x%08X",(ulong)(uint)hint);
    }
    return;
  }
  __assert_fail("value != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/window.c"
                ,0x19d,"void glfwWindowHintString(int, const char *)");
}

Assistant:

GLFWAPI void glfwWindowHintString(int hint, const char* value)
{
    assert(value != NULL);

    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_COCOA_FRAME_NAME:
            strncpy(_glfw.hints.window.ns.frameName, value,
                    sizeof(_glfw.hints.window.ns.frameName) - 1);
            return;
        case GLFW_X11_CLASS_NAME:
            strncpy(_glfw.hints.window.x11.className, value,
                    sizeof(_glfw.hints.window.x11.className) - 1);
            return;
        case GLFW_X11_INSTANCE_NAME:
            strncpy(_glfw.hints.window.x11.instanceName, value,
                    sizeof(_glfw.hints.window.x11.instanceName) - 1);
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint string 0x%08X", hint);
}